

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_resolve.cpp
# Opt level: O0

void __thiscall tst_qpromise_resolve::value(tst_qpromise_resolve *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  initializer_list<QtPromise::QPromise<int>_> *local_1c0;
  initializer_list<QtPromise::QPromise<int>_> *local_178;
  int local_144;
  const_iterator local_140;
  QPromise<int> *p_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  initializer_list<QtPromise::QPromise<int>_> local_120;
  QPromise<int> local_110;
  QPromise<int> local_100;
  initializer_list<QtPromise::QPromise<int>_> local_f0;
  initializer_list<QtPromise::QPromise<int>_> *local_e0;
  initializer_list<QtPromise::QPromise<int>_> *__range1_1;
  const_iterator local_d0;
  QPromise<int> *p;
  const_iterator local_c0;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<QtPromise::QPromise<int>_> local_a8;
  QPromise<int> local_98;
  QPromise<int> local_88;
  initializer_list<QtPromise::QPromise<int>_> local_78;
  initializer_list<QtPromise::QPromise<int>_> *local_68;
  initializer_list<QtPromise::QPromise<int>_> *__range1;
  QPromise<int> p2;
  undefined1 local_40 [8];
  QPromise<int> p1;
  undefined1 local_28 [8];
  QPromise<int> p0;
  int v1;
  int v0;
  tst_qpromise_resolve *this_local;
  
  p0.super_QPromiseBase<int>.m_d.d._4_4_ = 0x2a;
  p0.super_QPromiseBase<int>.m_d.d._0_4_ = 0x2a;
  p1.super_QPromiseBase<int>.m_d.d._4_4_ = 0x2a;
  QtPromise::QPromise<int>::resolve
            ((QPromise<int> *)local_28,(int *)((long)&p1.super_QPromiseBase<int>.m_d.d + 4));
  QtPromise::QPromise<int>::resolve
            ((QPromise<int> *)local_40,(int *)((long)&p0.super_QPromiseBase<int>.m_d.d + 4));
  QtPromise::QPromise<int>::resolve
            ((QPromise<int> *)&__range1,(int *)&p0.super_QPromiseBase<int>.m_d);
  __begin1 = (const_iterator)&local_a8;
  QtPromise::QPromise<int>::QPromise<QtPromise::QPromise<int>&>(__begin1,(QPromise<int> *)local_28);
  __begin1 = &local_98;
  QtPromise::QPromise<int>::QPromise<QtPromise::QPromise<int>&>(__begin1,(QPromise<int> *)local_40);
  __begin1 = &local_88;
  QtPromise::QPromise<int>::QPromise<QtPromise::QPromise<int>&>(__begin1,(QPromise<int> *)&__range1)
  ;
  local_78._M_array = (iterator)&local_a8;
  local_78._M_len = 3;
  local_68 = &local_78;
  __end1 = std::initializer_list<QtPromise::QPromise<int>_>::begin(local_68);
  local_c0 = std::initializer_list<QtPromise::QPromise<int>_>::end(local_68);
  for (; __end1 != local_c0; __end1 = __end1 + 1) {
    local_d0 = __end1;
    __range1_1._7_1_ = QtPromise::QPromiseBase<int>::isFulfilled(&__end1->super_QPromiseBase<int>);
    __range1_1._6_1_ = 1;
    bVar1 = QTest::qCompare<bool,bool>
                      ((bool *)((long)&__range1_1 + 7),(bool *)((long)&__range1_1 + 6),
                       "p.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_resolve.cpp"
                       ,0x2e);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      p._4_4_ = 1;
      goto LAB_001047ce;
    }
  }
  p._4_4_ = 2;
LAB_001047ce:
  local_178 = &local_78;
  do {
    local_178 = local_178 + -1;
    QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_178);
  } while (local_178 != &local_a8);
  if (p._4_4_ == 2) {
    __begin1_1 = (const_iterator)&local_120;
    QtPromise::QPromise<int>::QPromise<QtPromise::QPromise<int>&>
              (__begin1_1,(QPromise<int> *)local_28);
    __begin1_1 = &local_110;
    QtPromise::QPromise<int>::QPromise<QtPromise::QPromise<int>&>
              (__begin1_1,(QPromise<int> *)local_40);
    __begin1_1 = &local_100;
    QtPromise::QPromise<int>::QPromise<QtPromise::QPromise<int>&>
              (__begin1_1,(QPromise<int> *)&__range1);
    local_f0._M_array = (iterator)&local_120;
    local_f0._M_len = 3;
    local_e0 = &local_f0;
    __end1_1 = std::initializer_list<QtPromise::QPromise<int>_>::begin(local_e0);
    p_1 = std::initializer_list<QtPromise::QPromise<int>_>::end(local_e0);
    for (; __end1_1 != p_1; __end1_1 = __end1_1 + 1) {
      local_140 = __end1_1;
      local_144 = -1;
      iVar3 = waitForValue<int>(__end1_1,&local_144);
      bVar2 = QTest::qCompare(iVar3,0x2a,"waitForValue(p, -1)","42",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_resolve.cpp"
                              ,0x31);
      if (((bVar2 ^ 0xff) & 1) != 0) {
        p._4_4_ = 1;
        goto LAB_00104a35;
      }
    }
    p._4_4_ = 6;
LAB_00104a35:
    local_1c0 = &local_f0;
    do {
      local_1c0 = local_1c0 + -1;
      QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_1c0);
    } while (local_1c0 != &local_120);
    if (p._4_4_ == 6) {
      p._4_4_ = 0;
    }
  }
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)&__range1);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_40);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_28);
  return;
}

Assistant:

void tst_qpromise_resolve::value()
{
    int v0 = 42;
    const int v1 = 42;

    auto p0 = QtPromise::QPromise<int>::resolve(42);
    auto p1 = QtPromise::QPromise<int>::resolve(v0);
    auto p2 = QtPromise::QPromise<int>::resolve(v1);

    Q_STATIC_ASSERT((std::is_same<decltype(p0), QtPromise::QPromise<int>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p1), QtPromise::QPromise<int>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p2), QtPromise::QPromise<int>>::value));

    for (const auto& p : {p0, p1, p2}) {
        QCOMPARE(p.isFulfilled(), true);
    }
    for (const auto& p : {p0, p1, p2}) {
        QCOMPARE(waitForValue(p, -1), 42);
    }
}